

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root,uchar **strings,
               size_t n)

{
  byte bVar1;
  bool bVar2;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this;
  vector_brodnik<unsigned_char_*> *this_00;
  size_t sVar3;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *pTVar4;
  uint index;
  size_t depth;
  size_t sVar5;
  BurstSimple<unsigned_char> local_49;
  uchar *str;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *local_40;
  uchar **local_38;
  
  sVar5 = 0;
  local_40 = root;
  local_38 = strings;
  do {
    if (sVar5 == n) {
      return;
    }
    str = local_38[sVar5];
    bVar1 = get_char<unsigned_char>(str,0);
    depth = 1;
    this = local_40;
    while( true ) {
      index = (uint)bVar1;
      bVar2 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::is_trie(this,index);
      if (!bVar2) break;
      if (bVar1 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      this = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node(this,index);
      bVar1 = get_char<unsigned_char>(str,depth);
      depth = depth + 1;
    }
    this_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket
                        (this,(uint)bVar1);
    if (this_00 == (vector_brodnik<unsigned_char_*> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                   );
    }
    vector_brodnik<unsigned_char_*>::push_back(this_00,&str);
    if (index != 0) {
      sVar3 = vector_brodnik<unsigned_char_*>::size(this_00);
      if (0x4000 < sVar3) {
        pTVar4 = BurstSimple<unsigned_char>::operator()(&local_49,this_00,depth);
        (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[bVar1] = pTVar4;
        make_trie((this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + bVar1);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(this_00);
        operator_delete(this_00);
      }
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}